

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_OnlyReportsUnusedImportsForFilesBeingGenerated_Test::TestBody
          (CommandLineInterfaceTest_OnlyReportsUnusedImportsForFilesBeingGenerated_Test *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view contents;
  string_view contents_00;
  string_view contents_01;
  allocator<char> local_31;
  string local_30;
  
  name._M_str = "unused.proto";
  name._M_len = 0xc;
  contents._M_str = "syntax = \"proto2\";\nmessage Unused {}\n";
  contents._M_len = 0x25;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "bar.proto";
  name_00._M_len = 9;
  contents_00._M_str = "syntax = \"proto2\";\nimport \"unused.proto\";\nmessage Bar {}\n";
  contents_00._M_len = 0x39;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  name_01._M_str = "foo.proto";
  name_01._M_len = 9;
  contents_01._M_str =
       "syntax = \"proto2\";\nimport \"bar.proto\";\nmessage Foo {\n  optional Bar bar = 1;\n}\n";
  contents_01._M_len = 0x4f;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_01,contents_01)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto",&local_31);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       OnlyReportsUnusedImportsForFilesBeingGenerated) {
  CreateTempFile("unused.proto",
                 "syntax = \"proto2\";\n"
                 "message Unused {}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "import \"unused.proto\";\n"
                 "message Bar {}\n");
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "import \"bar.proto\";\n"
                 "message Foo {\n"
                 "  optional Bar bar = 1;\n"
                 "}\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto");
  ExpectNoErrors();
}